

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  cmMakefile *pcVar1;
  iterator this_00;
  bool bVar2;
  TargetType TVar3;
  cmGlobalGenerator *this_01;
  cmake *this_02;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar4;
  cmMakefileTargetGenerator *pcVar5;
  auto_ptr<cmMakefileTargetGenerator> local_d0;
  auto_ptr<cmMakefileTargetGenerator> tg;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_c0;
  iterator t;
  cmGlobalUnixMakefileGenerator3 *gg;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  cmLocalUnixMakefileGenerator3 *local_10;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  this_01 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
  this_02 = cmGlobalGenerator::GetCMakeInstance(this_01);
  bVar2 = cmake::GetIsInTryCompile(this_02);
  if (!bVar2) {
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"CMAKE_COLOR_MAKEFILE",&local_31);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_30);
    this->ColorMakefile = bVar2;
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES",&local_69)
  ;
  bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
  this->SkipPreprocessedSourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES",
             (allocator *)
             ((long)&targets.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_90);
  this->SkipAssemblySourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&targets.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __x = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&gg,__x);
  t._M_current = (cmGeneratorTarget **)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  local_c0._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&gg);
  while( true ) {
    tg.x_ = (cmMakefileTargetGenerator *)
            std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                      ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&gg);
    bVar2 = __gnu_cxx::operator!=
                      (&local_c0,
                       (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        *)&tg);
    if (!bVar2) break;
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_c0);
    TVar3 = cmGeneratorTarget::GetType(*ppcVar4);
    if (TVar3 != INTERFACE_LIBRARY) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_c0);
      pcVar5 = cmMakefileTargetGenerator::New(*ppcVar4);
      ::cm::auto_ptr<cmMakefileTargetGenerator>::auto_ptr(&local_d0,pcVar5);
      pcVar5 = ::cm::auto_ptr<cmMakefileTargetGenerator>::get(&local_d0);
      if (pcVar5 != (cmMakefileTargetGenerator *)0x0) {
        pcVar5 = ::cm::auto_ptr<cmMakefileTargetGenerator>::operator->(&local_d0);
        (*(pcVar5->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])();
        this_00 = t;
        pcVar5 = ::cm::auto_ptr<cmMakefileTargetGenerator>::get(&local_d0);
        cmGlobalUnixMakefileGenerator3::RecordTargetProgress
                  ((cmGlobalUnixMakefileGenerator3 *)this_00._M_current,pcVar5);
      }
      ::cm::auto_ptr<cmMakefileTargetGenerator>::~auto_ptr(&local_d0);
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_c0);
  }
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&gg);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    if ((*t)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    CM_AUTO_PTR<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(*t));
    if (tg.get()) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}